

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall jessilib::object::object(object *this,string_view_type *in_str)

{
  const_iterator __beg;
  const_iterator __end;
  allocator<char8_t> local_39;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_38;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *local_18;
  string_view_type *in_str_local;
  object *this_local;
  
  local_18 = in_str;
  in_str_local = (string_view_type *)this;
  __beg = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::begin(in_str);
  __end = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::end(local_18);
  std::allocator<char8_t>::allocator(&local_39);
  std::__cxx11::u8string::u8string<char8_t_const*,void>((u8string *)&local_38,__beg,__end,&local_39)
  ;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::variant<std::__cxx11::u8string,void,void,std::__cxx11::u8string,void>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)this,&local_38);
  std::__cxx11::u8string::~u8string((u8string *)&local_38);
  std::allocator<char8_t>::~allocator(&local_39);
  return;
}

Assistant:

object::object(const string_view_type& in_str)
	: m_value{ string_type{ in_str.begin(), in_str.end() } } {
	// Empty ctor body
}